

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartitioningAroundMedoids.h
# Opt level: O2

void __thiscall
CPartitioningAroundMedois<CDissimilarityMatrix<float>_>::CPartitioningAroundMedois
          (CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this,
          DissimilarityMatrixType *dissimilarityMatrix,size_t _numberOfClusters)

{
  invalid_argument *this_00;
  
  this->matrix = dissimilarityMatrix;
  this->numberOfClusters = _numberOfClusters;
  this->state = Initializing;
  (this->objectSecondMedoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->objectMedoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objectMedoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objectMedoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->objectSecondMedoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objectSecondMedoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((1 < _numberOfClusters) && (_numberOfClusters <= dissimilarityMatrix->size)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (&this->medoids,_numberOfClusters);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->objectMedoids,this->matrix->size);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->objectSecondMedoids,this->matrix->size);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"CPartitioningAroundMedois initializing failed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

explicit CPartitioningAroundMedois( const DissimilarityMatrixType& dissimilarityMatrix,
			size_t _numberOfClusters ) :
		matrix( dissimilarityMatrix ),
		numberOfClusters( _numberOfClusters ),
		state( Initializing )
	{
		if( numberOfClusters < 2 || numberOfClusters > matrix.Size() ) {
			throw invalid_argument( "CPartitioningAroundMedois initializing failed" );
		}

		medoids.reserve( numberOfClusters );
		objectMedoids.resize( matrix.Size() );
		objectSecondMedoids.resize( matrix.Size() );
	}